

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::LoadInstr::clone(LoadInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_28;
  unique_ptr<flow::LoadInstr,_std::default_delete<flow::LoadInstr>_> local_20;
  undefined1 local_18 [8];
  LoadInstr *this_local;
  
  local_18 = (undefined1  [8])__fn;
  this_local = this;
  local_28 = variable((LoadInstr *)__fn);
  Value::name_abi_cxx11_((Value *)__fn);
  std::make_unique<flow::LoadInstr,flow::Value*,std::__cxx11::string_const&>
            ((Value **)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::LoadInstr,std::default_delete<flow::LoadInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,&local_20);
  std::unique_ptr<flow::LoadInstr,_std::default_delete<flow::LoadInstr>_>::~unique_ptr(&local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> LoadInstr::clone() {
  return std::make_unique<LoadInstr>(variable(), name());
}